

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int sqlite3VdbeMemGrow(Mem *pMem,int n,int bPreserve)

{
  byte *pbVar1;
  sqlite3 *psVar2;
  uint uVar3;
  char *pcVar4;
  bool bVar5;
  
  if ((bPreserve == 0 || pMem->szMalloc < 1) || (pcVar4 = pMem->z, pcVar4 != pMem->zMalloc)) {
    if (0 < pMem->szMalloc) {
      sqlite3DbFreeNN(pMem->db,pMem->zMalloc);
    }
    if (pMem->db == (sqlite3 *)0x0) {
      pcVar4 = (char *)sqlite3Malloc((long)n);
    }
    else {
      pcVar4 = (char *)sqlite3DbMallocRawNN(pMem->db,(long)n);
    }
    pMem->zMalloc = pcVar4;
    bVar5 = bPreserve == 0;
  }
  else {
    if (pMem->db == (sqlite3 *)0x0) {
      pcVar4 = (char *)sqlite3Realloc(pcVar4,(long)n);
      pMem->zMalloc = pcVar4;
      if (pcVar4 == (char *)0x0) {
        sqlite3_free(pMem->z);
      }
      pcVar4 = pMem->zMalloc;
    }
    else {
      pcVar4 = (char *)sqlite3DbReallocOrFree(pMem->db,pcVar4,(long)n);
      pMem->zMalloc = pcVar4;
    }
    pMem->z = pcVar4;
    bVar5 = true;
  }
  pcVar4 = pMem->zMalloc;
  if (pcVar4 == (char *)0x0) {
    if ((pMem->flags & 0x9000) == 0) {
      pMem->flags = 1;
    }
    else {
      vdbeMemClearExternAndSetNull(pMem);
    }
    pMem->z = (char *)0x0;
    pMem->szMalloc = 0;
    return 7;
  }
  psVar2 = pMem->db;
  if ((psVar2 != (sqlite3 *)0x0) && (pcVar4 < (psVar2->lookaside).pTrueEnd)) {
    uVar3 = 0x80;
    if ((psVar2->lookaside).pMiddle <= pcVar4) goto LAB_00144672;
    if ((psVar2->lookaside).pStart <= pcVar4) {
      uVar3 = (uint)(psVar2->lookaside).szTrue;
      goto LAB_00144672;
    }
  }
  uVar3 = (*sqlite3Config.m.xSize)(pcVar4);
LAB_00144672:
  pMem->szMalloc = uVar3;
  if ((!bVar5) && (pMem->z != (char *)0x0)) {
    memcpy(pMem->zMalloc,pMem->z,(long)pMem->n);
  }
  if ((pMem->flags & 0x1000) != 0) {
    (*pMem->xDel)(pMem->z);
  }
  pMem->z = pMem->zMalloc;
  pbVar1 = (byte *)((long)&pMem->flags + 1);
  *pbVar1 = *pbVar1 & 0x8f;
  return 0;
}

Assistant:

int sqlite3VdbeMemGrow(Mem *pMem, int n, int bPreserve){
  assert( sqlite3VdbeCheckMemInvariants(pMem) );
  assert( !sqlite3VdbeMemIsRowSet(pMem) );
  testcase( pMem->db==0 );

  /* If the bPreserve flag is set to true, then the memory cell must already
  ** contain a valid string or blob value.  */
  assert( bPreserve==0 || pMem->flags&(MEM_Blob|MEM_Str) );
  testcase( bPreserve && pMem->z==0 );

  assert( pMem->szMalloc==0
       || (pMem->flags==MEM_Undefined
           && pMem->szMalloc<=sqlite3DbMallocSize(pMem->db,pMem->zMalloc))
       || pMem->szMalloc==sqlite3DbMallocSize(pMem->db,pMem->zMalloc));
  if( pMem->szMalloc>0 && bPreserve && pMem->z==pMem->zMalloc ){
    if( pMem->db ){
      pMem->z = pMem->zMalloc = sqlite3DbReallocOrFree(pMem->db, pMem->z, n);
    }else{
      pMem->zMalloc = sqlite3Realloc(pMem->z, n);
      if( pMem->zMalloc==0 ) sqlite3_free(pMem->z);
      pMem->z = pMem->zMalloc;
    }
    bPreserve = 0;
  }else{
    if( pMem->szMalloc>0 ) sqlite3DbFreeNN(pMem->db, pMem->zMalloc);
    pMem->zMalloc = sqlite3DbMallocRaw(pMem->db, n);
  }
  if( pMem->zMalloc==0 ){
    sqlite3VdbeMemSetNull(pMem);
    pMem->z = 0;
    pMem->szMalloc = 0;
    return SQLITE_NOMEM_BKPT;
  }else{
    pMem->szMalloc = sqlite3DbMallocSize(pMem->db, pMem->zMalloc);
  }

  if( bPreserve && pMem->z ){
    assert( pMem->z!=pMem->zMalloc );
    memcpy(pMem->zMalloc, pMem->z, pMem->n);
  }
  if( (pMem->flags&MEM_Dyn)!=0 ){
    assert( pMem->xDel!=0 && pMem->xDel!=SQLITE_DYNAMIC );
    pMem->xDel((void *)(pMem->z));
  }

  pMem->z = pMem->zMalloc;
  pMem->flags &= ~(MEM_Dyn|MEM_Ephem|MEM_Static);
  return SQLITE_OK;
}